

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O1

void __thiscall QPlainTestLogger::stopLogging(QPlainTestLogger *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  qint64 qVar7;
  char *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  char buf [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(buf,0xaa,0x400);
  qVar7 = QTestLog::nsecsTotalTime();
  uVar9 = (ulong)(uint)(int)((double)((ulong)((double)qVar7 / 1000000.0) & 0x8000000000000000 |
                                     (ulong)DAT_001570b0) + (double)qVar7 / 1000000.0);
  iVar2 = QTestLog::verboseLevel();
  uVar3 = QTestLog::passCount();
  uVar4 = QTestLog::failCount();
  uVar5 = QTestLog::skipCount();
  uVar6 = QTestLog::blacklistCount();
  if (iVar2 < 0) {
    snprintf(buf,0x400,"Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n",
             (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,uVar9);
  }
  else {
    pcVar8 = QTestResult::currentTestObjectName();
    snprintf(buf,0x400,
             "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n********* Finished testing of %s *********\n"
             ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,uVar9,pcVar8);
  }
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,buf);
  QAbstractTestLogger::stopLogging(&this->super_QAbstractTestLogger);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::stopLogging()
{
    char buf[1024];
    const int timeMs = qRound(QTestLog::msecsTotalTime());
    if (QTestLog::verboseLevel() < 0) {
        std::snprintf(buf, sizeof(buf),
                      "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n",
                      QTestLog::passCount(), QTestLog::failCount(),
                      QTestLog::skipCount(), QTestLog::blacklistCount(), timeMs);
    } else {
        std::snprintf(buf, sizeof(buf),
                      "Totals: %d passed, %d failed, %d skipped, %d blacklisted, %dms\n"
                      "********* Finished testing of %s *********\n",
                      QTestLog::passCount(), QTestLog::failCount(),
                      QTestLog::skipCount(), QTestLog::blacklistCount(), timeMs,
                      QTestResult::currentTestObjectName());
    }
    outputMessage(buf);

    QAbstractTestLogger::stopLogging();
}